

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O1

int ichol(double *A,int N)

{
  int iVar1;
  double *U22;
  size_t __n;
  ulong uVar2;
  
  U22 = (double *)malloc((long)N * (long)N * 8);
  iVar1 = richolu(A,N,N,U22);
  if (0 < N) {
    uVar2 = 0;
    __n = 0;
    do {
      if (__n != 0) {
        memset(A + uVar2,0,__n);
      }
      __n = __n + 8;
      uVar2 = (ulong)(uint)((int)uVar2 + N);
    } while ((ulong)(uint)N << 3 != __n);
  }
  free(U22);
  return iVar1;
}

Assistant:

int ichol(double *A, int N) {
	int sc;
	sc = icholu(A,N);
	return sc;
}